

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckSemicolonSpace.cxx
# Opt level: O3

bool __thiscall kws::Parser::CheckSemicolonSpace(Parser *this,unsigned_long max)

{
  string *psVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  char *__s;
  size_t sVar6;
  char *pcVar7;
  size_t pos;
  size_t sVar8;
  ulong uVar9;
  ulong size;
  Error error;
  value_type local_d0;
  unsigned_long local_98;
  string local_90;
  string local_70;
  string local_50;
  
  this->m_TestsDone[7] = true;
  __s = (char *)operator_new__(0xff);
  bVar5 = 0;
  local_98 = max;
  snprintf(__s,0xff,"Semicolons = %ld max spaces",max);
  pcVar7 = (char *)this->m_TestsDescription[7]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 7),0,pcVar7,(ulong)__s);
  operator_delete__(__s);
  psVar1 = &this->m_BufferNoComment;
  sVar6 = std::__cxx11::string::find((char *)psVar1,0x175d46,0);
  if (sVar6 != 0xffffffffffffffff) {
    bVar5 = 0;
    do {
      if (0 < (long)sVar6) {
        size = 0;
        uVar9 = sVar6;
        do {
          sVar8 = uVar9 - 1;
          cVar2 = (psVar1->_M_dataplus)._M_p[sVar8];
          if (cVar2 != ' ') {
            if ((cVar2 != '\n') && (local_98 < size)) {
              local_d0.description._M_dataplus._M_p = (pointer)&local_d0.description.field_2;
              local_d0.description._M_string_length = 0;
              local_d0.description.field_2._M_local_buf[0] = '\0';
              local_d0.line = GetLineNumber(this,sVar6,true);
              local_d0.number = 7;
              local_d0.line2 = local_d0.line;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_d0.description,0,
                         (char *)local_d0.description._M_string_length,0x17622e);
              pcVar7 = (char *)operator_new__(10);
              snprintf(pcVar7,10,"%ld",size);
              std::__cxx11::string::append((char *)&local_d0.description);
              std::__cxx11::string::append((char *)&local_d0.description);
              operator_delete__(pcVar7);
              pcVar7 = (char *)operator_new__(10);
              snprintf(pcVar7,10,"%ld",local_98);
              std::__cxx11::string::append((char *)&local_d0.description);
              std::__cxx11::string::append((char *)&local_d0.description);
              operator_delete__(pcVar7);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,&local_d0);
              if (this->m_FixFile == true) {
                sVar8 = GetPositionWithComments(this,sVar6 - size);
                ReplaceCharInFixedBuffer(this,sVar8,size,"");
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0.description._M_dataplus._M_p != &local_d0.description.field_2) {
                operator_delete(local_d0.description._M_dataplus._M_p);
              }
              bVar5 = 1;
            }
            break;
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
          bVar4 = IsBetweenQuote(this,sVar8,false,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          size = size + !bVar4;
          bVar4 = 1 < uVar9;
          uVar9 = sVar8;
        } while (bVar4);
      }
      sVar6 = std::__cxx11::string::find((char *)psVar1,0x175d46,sVar6 + 1);
    } while (sVar6 != 0xffffffffffffffff);
  }
  sVar6 = std::__cxx11::string::find((char *)psVar1,0x175d46,0);
  if (sVar6 != 0xffffffffffffffff) {
    do {
      if (sVar6 + 1 < (this->m_BufferNoComment)._M_string_length) {
        do {
          sVar8 = sVar6 + 1;
          bVar3 = (psVar1->_M_dataplus)._M_p[sVar6 + 1];
          if (bVar3 < 0x20) {
            if ((bVar3 != 10) && (bVar3 != 0xd)) break;
          }
          else if (bVar3 != 0x20) {
            if (bVar3 != 0x3b) break;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
            bVar4 = IsBetweenCharsFast(this,'(',')',sVar8,false,&local_70);
            if (bVar4) {
              bVar4 = false;
            }
            else {
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
              bVar4 = IsBetweenQuote(this,sVar8,false,&local_90);
              bVar4 = !bVar4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (bVar4) {
              local_d0.description._M_dataplus._M_p = (pointer)&local_d0.description.field_2;
              local_d0.description._M_string_length = 0;
              local_d0.description.field_2._M_local_buf[0] = '\0';
              local_d0.line = GetLineNumber(this,sVar8,true);
              local_d0.number = 7;
              local_d0.line2 = local_d0.line;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_d0.description,0,
                         (char *)local_d0.description._M_string_length,0x176259);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,&local_d0);
              if (this->m_FixFile == true) {
                pos = GetPositionWithComments(this,sVar8);
                ReplaceCharInFixedBuffer(this,pos,1,"");
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0.description._M_dataplus._M_p != &local_d0.description.field_2) {
                operator_delete(local_d0.description._M_dataplus._M_p);
              }
              bVar5 = 1;
            }
          }
          uVar9 = sVar6 + 2;
          sVar6 = sVar8;
        } while (uVar9 < (this->m_BufferNoComment)._M_string_length);
      }
      sVar6 = std::__cxx11::string::find((char *)psVar1,0x175d46,sVar6 + 2);
    } while (sVar6 != 0xffffffffffffffff);
  }
  return (bool)(~bVar5 & 1);
}

Assistant:

bool Parser::CheckSemicolonSpace(unsigned long max)
{
  m_TestsDone[SEMICOLON_SPACE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Semicolons = %ld max spaces",max);
  m_TestsDescription[SEMICOLON_SPACE] = val;
  delete [] val;

  bool hasError = false;
  auto posSemicolon = static_cast<long int>(m_BufferNoComment.find(";", 0));
  while(posSemicolon != -1)
    {
    // We try to find the word before that
    long i=posSemicolon-1;
    unsigned long space = 0;
    while(i>=0)
      {
       if(m_BufferNoComment[i] == ' ')
        {
        if(!IsBetweenQuote(i))
          {
          space++;
          }
        }
       else
        {
        if(m_BufferNoComment[i] != '\n' && space > max)
          {
          Error error;
          error.line = this->GetLineNumber(posSemicolon,true);
          error.line2 = error.line;
          error.number = SEMICOLON_SPACE;
          error.description = "Number of spaces before semicolon exceed: ";
          constexpr size_t length = 10;
          char* localval = new char[length];
          snprintf(localval,length,"%ld",space);
          error.description += localval;
          error.description += " (max=";
          delete [] localval;
          localval = new char[length];
          snprintf(localval,length,"%ld",max);
          error.description += localval;
          error.description += ")";
          delete [] localval;
          m_ErrorList.push_back(error);
          hasError = true;

          if(m_FixFile)
            {
            this->ReplaceCharInFixedBuffer(this->GetPositionWithComments(posSemicolon-space),space,"");
            }
          } // space > max
        break;
        }
      i--;
      }
    posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",posSemicolon+1));
    }

  // We also check if we have two or more semicolons following each other
  posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",0));
  while(posSemicolon != -1)
    {
    // We look forward
    unsigned long i=posSemicolon+1;
    while(i<m_BufferNoComment.size())
      {
      if(m_BufferNoComment[i] == ' ' || m_BufferNoComment[i] == '\r' || m_BufferNoComment[i] == '\n')
        {
        // this is normal
        }
      else if(m_BufferNoComment[i] == ';')
        {
        // if we have for ( ;; ) we don't report
        // or ";;"
        if(!this->IsBetweenCharsFast('(',')',i)
           && !this->IsBetweenQuote(i))
          {
          Error error;
          error.line = this->GetLineNumber(i,true);
          error.line2 = error.line;
          error.number = SEMICOLON_SPACE;
          error.description = "Too many semicolons";
          m_ErrorList.push_back(error);
          hasError = true;

          if(m_FixFile)
            {
            this->ReplaceCharInFixedBuffer(this->GetPositionWithComments(i),1,"");
            }
          }
        }
      else
        {
        break;
        }
      i++;
      }
    posSemicolon = static_cast<long int>(m_BufferNoComment.find(";",i+1));
    }

  return !hasError;
}